

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

opj_image_t *
rawtoimage_common(char *filename,opj_cparameters_t *parameters,raw_cparameters_t *raw_cp,
                 OPJ_BOOL big_endian)

{
  int iVar1;
  int iVar2;
  int iVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  undefined8 uVar6;
  raw_comp_cparameters_t *prVar7;
  uint uVar8;
  ushort uVar9;
  int *piVar10;
  ushort uVar11;
  int iVar12;
  FILE *__stream;
  int *piVar13;
  size_t sVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  opj_cparameters_t *poVar18;
  opj_image_t *poVar19;
  char *__ptr;
  uchar value;
  uchar temp2;
  uchar temp1;
  opj_image_t *local_60;
  int *local_58;
  opj_cparameters_t *local_50;
  opj_cparameters_t *local_48;
  opj_cparameters_t *local_40;
  unsigned_short ch;
  
  local_40 = (opj_cparameters_t *)CONCAT44(local_40._4_4_,big_endian);
  if ((raw_cp->rawBitDepth & raw_cp->rawHeight & raw_cp->rawComp & raw_cp->rawWidth) == 0) {
    iVar1 = parameters->subsampling_dx;
    iVar2 = parameters->subsampling_dy;
    __stream = fopen(filename,"rb");
    if (__stream != (FILE *)0x0) {
      local_58 = (int *)(ulong)(uint)raw_cp->rawComp;
      if (local_58 == (int *)0x1) {
        iVar12 = 2;
      }
      else if (raw_cp->rawComp < 3) {
        iVar12 = -1;
      }
      else {
        iVar12 = 3;
        if (parameters->tcp_mct != '\0') {
          iVar12 = (uint)(parameters->tcp_mct != '\x02') * 2 + -1;
        }
      }
      local_60 = (opj_image_t *)CONCAT44(local_60._4_4_,iVar12);
      iVar12 = raw_cp->rawWidth;
      iVar3 = raw_cp->rawHeight;
      local_50 = parameters;
      piVar13 = (int *)calloc((size_t)local_58,0x24);
      piVar10 = local_58;
      if (piVar13 == (int *)0x0) {
        fwrite("Failed to allocate image components parameters !!\n",0x32,1,_stderr);
        fwrite("Aborting\n",9,1,_stderr);
      }
      else {
        poVar18 = (opj_cparameters_t *)0x0;
        local_48 = (opj_cparameters_t *)0x0;
        piVar15 = piVar13;
        if (0 < (int)local_58) {
          local_48 = (opj_cparameters_t *)((ulong)local_58 & 0xffffffff);
        }
        for (; local_48 != poVar18;
            poVar18 = (opj_cparameters_t *)((long)&poVar18->tile_size_on + 1)) {
          uVar6._0_4_ = raw_cp->rawBitDepth;
          uVar6._4_4_ = raw_cp->rawSigned;
          piVar15[6] = (undefined4)uVar6;
          *(undefined8 *)(piVar15 + 7) = uVar6;
          prVar7 = raw_cp->rawComps;
          *piVar15 = prVar7[(long)poVar18].dx * iVar1;
          piVar15[1] = prVar7[(long)poVar18].dy * iVar2;
          piVar15[2] = iVar12;
          piVar15[3] = iVar3;
          piVar15 = piVar15 + 9;
        }
        local_58 = piVar13;
        local_60 = (opj_image_t *)opj_image_create(piVar10,piVar13,(ulong)local_60 & 0xffffffff);
        free(local_58);
        poVar19 = local_60;
        if (local_60 != (opj_image_t *)0x0) {
          OVar4 = local_50->image_offset_x0;
          local_60->x0 = OVar4;
          OVar5 = local_50->image_offset_y0;
          local_60->y0 = OVar5;
          local_60->x1 = OVar4 + (iVar12 + -1) * iVar1 + 1;
          local_60->y1 = OVar5 + (iVar3 + -1) * iVar2 + 1;
          if (raw_cp->rawBitDepth < 9) {
            value = '\0';
            local_58 = (int *)(ulong)(uint)(iVar3 * iVar12);
            poVar18 = (opj_cparameters_t *)0x0;
            while (poVar18 != local_48) {
              uVar16 = (long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 |
                             (ulong)local_58 & 0xffffffff) /
                       (long)(raw_cp->rawComps[(long)poVar18].dy *
                             raw_cp->rawComps[(long)poVar18].dx);
              uVar17 = uVar16 & 0xffffffff;
              if ((int)uVar16 < 1) {
                uVar17 = 0;
              }
              local_40 = poVar18;
              for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
                sVar14 = fread(&value,1,1,__stream);
                if (sVar14 == 0) {
                  fwrite("Error reading raw file. End of file probably reached.\n",0x36,1,_stderr);
                  opj_image_destroy(local_60);
                  goto LAB_001091d8;
                }
                uVar8 = (int)(char)value;
                if (raw_cp->rawSigned == 0) {
                  uVar8 = (uint)value;
                }
                local_60->comps[(long)poVar18].data[uVar16] = uVar8;
              }
              poVar18 = (opj_cparameters_t *)((long)&local_40->tile_size_on + 1);
            }
          }
          else {
            if (0x10 < (uint)raw_cp->rawBitDepth) {
              fwrite("OpenJPEG cannot encode raw components with bit depth higher than 16 bits.\n",
                     0x4a,1,_stderr);
LAB_00109068:
              opj_image_destroy(poVar19);
              goto LAB_001091d8;
            }
            local_58 = (int *)(ulong)(uint)(iVar3 * iVar12);
            poVar18 = (opj_cparameters_t *)0x0;
            while (poVar18 != local_48) {
              uVar16 = (long)((ulong)(uint)((int)local_58 >> 0x1f) << 0x20 |
                             (ulong)local_58 & 0xffffffff) /
                       (long)(raw_cp->rawComps[(long)poVar18].dy *
                             raw_cp->rawComps[(long)poVar18].dx);
              uVar17 = uVar16 & 0xffffffff;
              if ((int)uVar16 < 1) {
                uVar17 = 0;
              }
              local_50 = poVar18;
              for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
                sVar14 = fread(&temp1,1,1,__stream);
                if ((sVar14 == 0) || (sVar14 = fread(&temp2,1,1,__stream), sVar14 == 0)) {
                  fwrite("Error reading raw file. End of file probably reached.\n",0x36,1,_stderr);
                  poVar19 = local_60;
                  goto LAB_00109068;
                }
                uVar9 = (ushort)temp1;
                uVar11 = (ushort)temp2;
                if ((int)local_40 == 0) {
                  uVar9 = (ushort)temp2;
                  uVar11 = (ushort)temp1;
                }
                uVar11 = uVar11 | uVar9 << 8;
                uVar8 = (uint)uVar11;
                if (raw_cp->rawSigned != 0) {
                  uVar8 = (int)(short)uVar11;
                }
                local_60->comps[(long)poVar18].data[uVar16] = uVar8;
              }
              poVar18 = (opj_cparameters_t *)((long)&local_50->tile_size_on + 1);
            }
          }
          sVar14 = fread(&ch,1,1,__stream);
          if (sVar14 != 0) {
            fwrite("Warning. End of raw file not reached... processing anyway\n",0x3a,1,_stderr);
          }
          fclose(__stream);
          return local_60;
        }
      }
LAB_001091d8:
      fclose(__stream);
      return (opj_image_t *)0x0;
    }
    fprintf(_stderr,"Failed to open %s for reading !!\n",filename);
    __ptr = "Aborting\n";
    sVar14 = 9;
  }
  else {
    fwrite("\nError: invalid raw image parameters\n",0x25,1,_stderr);
    fwrite("Please use the Format option -F:\n",0x21,1,_stderr);
    fwrite("-F <width>,<height>,<ncomp>,<bitdepth>,{s,u}@<dx1>x<dy1>:...:<dxn>x<dyn>\n",0x49,1,
           _stderr);
    fwrite("If subsampling is omitted, 1x1 is assumed for all components\n",0x3d,1,_stderr);
    fwrite("Example: -i image.raw -o image.j2k -F 512,512,3,8,u@1x1:2x2:2x2\n",0x40,1,_stderr);
    fwrite("         for raw 512x512 image with 4:2:0 subsampling\n",0x36,1,_stderr);
    __ptr = "Aborting.\n";
    sVar14 = 10;
  }
  fwrite(__ptr,sVar14,1,_stderr);
  return (opj_image_t *)0x0;
}

Assistant:

static opj_image_t* rawtoimage_common(const char *filename, opj_cparameters_t *parameters, raw_cparameters_t *raw_cp, OPJ_BOOL big_endian) {
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;

    FILE *f = NULL;
    int i, compno, numcomps, w, h;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t *cmptparm;
    opj_image_t * image = NULL;
    unsigned short ch;

    if((! (raw_cp->rawWidth & raw_cp->rawHeight & raw_cp->rawComp & raw_cp->rawBitDepth)) == 0)
    {
        fprintf(stderr,"\nError: invalid raw image parameters\n");
        fprintf(stderr,"Please use the Format option -F:\n");
        fprintf(stderr,"-F <width>,<height>,<ncomp>,<bitdepth>,{s,u}@<dx1>x<dy1>:...:<dxn>x<dyn>\n");
        fprintf(stderr,"If subsampling is omitted, 1x1 is assumed for all components\n");
        fprintf(stderr,"Example: -i image.raw -o image.j2k -F 512,512,3,8,u@1x1:2x2:2x2\n");
        fprintf(stderr,"         for raw 512x512 image with 4:2:0 subsampling\n");
        fprintf(stderr,"Aborting.\n");
        return NULL;
    }

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        fprintf(stderr,"Aborting\n");
        return NULL;
    }
    numcomps = raw_cp->rawComp;

    /* FIXME ADE at this point, tcp_mct has not been properly set in calling function */
    if (numcomps == 1) {
        color_space = OPJ_CLRSPC_GRAY;
    } else if ((numcomps >= 3) && (parameters->tcp_mct == 0)) {
        color_space = OPJ_CLRSPC_SYCC;
    } else if ((numcomps >= 3) && (parameters->tcp_mct != 2)) {
        color_space = OPJ_CLRSPC_SRGB;
    } else {
        color_space = OPJ_CLRSPC_UNKNOWN;
    }
    w = raw_cp->rawWidth;
    h = raw_cp->rawHeight;
    cmptparm = (opj_image_cmptparm_t*) calloc((OPJ_UINT32)numcomps,sizeof(opj_image_cmptparm_t));
    if (!cmptparm) {
        fprintf(stderr, "Failed to allocate image components parameters !!\n");
        fprintf(stderr,"Aborting\n");
        fclose(f);
        return NULL;
    }
    /* initialize image components */
    for(i = 0; i < numcomps; i++) {
        cmptparm[i].prec = (OPJ_UINT32)raw_cp->rawBitDepth;
        cmptparm[i].bpp = (OPJ_UINT32)raw_cp->rawBitDepth;
        cmptparm[i].sgnd = (OPJ_UINT32)raw_cp->rawSigned;
        cmptparm[i].dx = (OPJ_UINT32)(subsampling_dx * raw_cp->rawComps[i].dx);
        cmptparm[i].dy = (OPJ_UINT32)(subsampling_dy * raw_cp->rawComps[i].dy);
        cmptparm[i].w = (OPJ_UINT32)w;
        cmptparm[i].h = (OPJ_UINT32)h;
    }
    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);
    free(cmptparm);
    if(!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = (OPJ_UINT32)parameters->image_offset_x0 + (OPJ_UINT32)(w - 1) *	(OPJ_UINT32)subsampling_dx + 1;
    image->y1 = (OPJ_UINT32)parameters->image_offset_y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)subsampling_dy + 1;

    if(raw_cp->rawBitDepth <= 8)
    {
        unsigned char value = 0;
        for(compno = 0; compno < numcomps; compno++) {
            int nloop = (w*h)/(raw_cp->rawComps[compno].dx*raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                if (!fread(&value, 1, 1, f)) {
                    fprintf(stderr,"Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                image->comps[compno].data[i] = raw_cp->rawSigned?(char)value:value;
            }
        }
    }
    else if(raw_cp->rawBitDepth <= 16)
    {
        unsigned short value;
        for(compno = 0; compno < numcomps; compno++) {
            int nloop = (w*h)/(raw_cp->rawComps[compno].dx*raw_cp->rawComps[compno].dy);
            for (i = 0; i < nloop; i++) {
                unsigned char temp1;
                unsigned char temp2;
                if (!fread(&temp1, 1, 1, f)) {
                    fprintf(stderr,"Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&temp2, 1, 1, f)) {
                    fprintf(stderr,"Error reading raw file. End of file probably reached.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if( big_endian )
                {
                    value = (unsigned short)((temp1 << 8) + temp2);
                }
                else
                {
                    value = (unsigned short)((temp2 << 8) + temp1);
                }
                image->comps[compno].data[i] = raw_cp->rawSigned?(short)value:value;
            }
        }
    }
    else {
        fprintf(stderr,"OpenJPEG cannot encode raw components with bit depth higher than 16 bits.\n");
        opj_image_destroy(image);
        fclose(f);
        return NULL;
    }

    if (fread(&ch, 1, 1, f)) {
        fprintf(stderr,"Warning. End of raw file not reached... processing anyway\n");
    }
    fclose(f);

    return image;
}